

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdLoad.c
# Opt level: O2

int CmdCommandLoad(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Vec_Str_t *p;
  char *pcVar2;
  FILE *__stream;
  int level;
  long lVar4;
  Vec_Str_t *pVVar3;
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar2 = (char *)malloc(100);
  p->pArray = pcVar2;
  Vec_StrAppend(p,"abccmd_");
  Vec_StrAppend(p,*argv);
  Vec_StrAppend(p,".exe");
  Vec_StrPush(p,'\0');
  __stream = fopen(p->pArray,"r");
  if (__stream == (FILE *)0x0) {
    pVVar3 = p;
    Vec_StrFree(p);
    level = (int)pVVar3;
    pcVar2 = "Cannot run the binary \"%s\".\n\n";
  }
  else {
    fclose(__stream);
    if (p->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                    ,0x249,"char Vec_StrPop(Vec_Str_t *)");
    }
    p->nSize = p->nSize + -1;
    for (lVar4 = 1; lVar4 < argc; lVar4 = lVar4 + 1) {
      Vec_StrAppend(p," ");
      Vec_StrAppend(p,argv[lVar4]);
    }
    Vec_StrPush(p,'\0');
    iVar1 = Util_SignalSystem(p->pArray);
    pVVar3 = p;
    Vec_StrFree(p);
    level = (int)pVVar3;
    if (iVar1 == 0) {
      return 0;
    }
    Abc_Print(level,"The following command has returned non-zero exit status:\n");
    pcVar2 = "\"%s\"\n";
  }
  Abc_Print(level,pcVar2,p->pArray);
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function********************************************************************

  Synopsis    []

  Description []

  SideEffects []

  SeeAlso     []

******************************************************************************/
int CmdCommandLoad( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Str_t * vCommand;
    FILE * pFile;
    int i;
    vCommand = Vec_StrAlloc( 100 );
    Vec_StrAppend( vCommand, "abccmd_" );
    Vec_StrAppend( vCommand, argv[0] );
    Vec_StrAppend( vCommand, ".exe" );
    Vec_StrPush( vCommand, 0 );
    // check if there is the binary
    if ( (pFile = fopen( Vec_StrArray(vCommand), "r" )) == NULL )
    {
        Vec_StrFree( vCommand );
        Abc_Print( -1, "Cannot run the binary \"%s\".\n\n", Vec_StrArray(vCommand) );
        return 1;
    }
    fclose( pFile );
    Vec_StrPop( vCommand );
    // add other arguments
    for ( i = 1; i < argc; i++ )
    {
        Vec_StrAppend( vCommand, " " );
        Vec_StrAppend( vCommand, argv[i] );
    }
    Vec_StrPush( vCommand, 0 );
    // run the command line
    if ( Util_SignalSystem( Vec_StrArray(vCommand) ) )
    {
        Vec_StrFree( vCommand );
        Abc_Print( -1, "The following command has returned non-zero exit status:\n" );
        Abc_Print( -1, "\"%s\"\n", Vec_StrArray(vCommand) );
        return 1;
    }
    Vec_StrFree( vCommand );
    return 0;
}